

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

DistantLight * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::DistantLight,pbrt::Transform&,pbrt::SpectrumHandle&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,Transform *args,SpectrumHandle *args_1,
          float *args_2,polymorphic_allocator<std::byte> *args_3)

{
  Float FVar1;
  Allocator alloc;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_30;
  DistantLight *pDVar18;
  
  iVar17 = (*this->memoryResource->_vptr_memory_resource[2])(this->memoryResource,0xd8,8);
  pDVar18 = (DistantLight *)CONCAT44(extraout_var,iVar17);
  local_30.bits =
       (args_1->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  FVar1 = *args_2;
  alloc.memoryResource = args_3->memoryResource;
  (pDVar18->super_LightBase).type = DeltaDirection;
  uVar2 = *(undefined8 *)(args->m).m[0];
  uVar3 = *(undefined8 *)((args->m).m[0] + 2);
  uVar4 = *(undefined8 *)(args->m).m[1];
  uVar5 = *(undefined8 *)((args->m).m[1] + 2);
  uVar6 = *(undefined8 *)(args->m).m[2];
  uVar7 = *(undefined8 *)((args->m).m[2] + 2);
  uVar8 = *(undefined8 *)(args->m).m[3];
  uVar9 = *(undefined8 *)((args->m).m[3] + 2);
  uVar10 = *(undefined8 *)((args->mInv).m[0] + 2);
  uVar11 = *(undefined8 *)(args->mInv).m[1];
  uVar12 = *(undefined8 *)((args->mInv).m[1] + 2);
  uVar13 = *(undefined8 *)(args->mInv).m[2];
  uVar14 = *(undefined8 *)((args->mInv).m[2] + 2);
  uVar15 = *(undefined8 *)(args->mInv).m[3];
  uVar16 = *(undefined8 *)((args->mInv).m[3] + 2);
  *(undefined8 *)(pDVar18->super_LightBase).renderFromLight.mInv.m[0] =
       *(undefined8 *)(args->mInv).m[0];
  *(undefined8 *)((pDVar18->super_LightBase).renderFromLight.mInv.m[0] + 2) = uVar10;
  *(undefined8 *)(pDVar18->super_LightBase).renderFromLight.mInv.m[1] = uVar11;
  *(undefined8 *)((pDVar18->super_LightBase).renderFromLight.mInv.m[1] + 2) = uVar12;
  *(undefined8 *)(pDVar18->super_LightBase).renderFromLight.mInv.m[2] = uVar13;
  *(undefined8 *)((pDVar18->super_LightBase).renderFromLight.mInv.m[2] + 2) = uVar14;
  *(undefined8 *)(pDVar18->super_LightBase).renderFromLight.mInv.m[3] = uVar15;
  *(undefined8 *)((pDVar18->super_LightBase).renderFromLight.mInv.m[3] + 2) = uVar16;
  *(undefined8 *)(pDVar18->super_LightBase).renderFromLight.m.m[0] = uVar2;
  *(undefined8 *)((pDVar18->super_LightBase).renderFromLight.m.m[0] + 2) = uVar3;
  *(undefined8 *)(pDVar18->super_LightBase).renderFromLight.m.m[1] = uVar4;
  *(undefined8 *)((pDVar18->super_LightBase).renderFromLight.m.m[1] + 2) = uVar5;
  *(undefined8 *)(pDVar18->super_LightBase).renderFromLight.m.m[2] = uVar6;
  *(undefined8 *)((pDVar18->super_LightBase).renderFromLight.m.m[2] + 2) = uVar7;
  *(undefined8 *)(pDVar18->super_LightBase).renderFromLight.m.m[3] = uVar8;
  *(undefined8 *)((pDVar18->super_LightBase).renderFromLight.m.m[3] + 2) = uVar9;
  (pDVar18->super_LightBase).mediumInterface.inside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (pDVar18->super_LightBase).mediumInterface.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  *(long *)(in_FS_OFFSET + -0x470) = *(long *)(in_FS_OFFSET + -0x470) + 1;
  pbrt::DenselySampledSpectrum::DenselySampledSpectrum
            (&pDVar18->Lemit,(SpectrumHandle *)&local_30,0x168,0x33e,alloc);
  pDVar18->scale = FVar1;
  (pDVar18->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (pDVar18->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (pDVar18->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  return pDVar18;
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }